

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O2

bool checkCreterion(Mesh *mesh,VectorXd *x,double epsilon)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  _Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true> _Var8;
  long lVar9;
  int iVar10;
  VectorT<double,3> *this;
  EdgeHandle _eh;
  _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true> itr;
  long lVar11;
  VectorT<double,_2> *_rhs;
  double dVar12;
  PolyConnectivity *pPVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  type tVar17;
  type tVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>_>
  pVar21;
  undefined1 auVar22 [12];
  GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  __begin2;
  double xc;
  Vec2d e1;
  Vec2d param [3];
  double yc;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __begin1;
  GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  __end2;
  Vec3d pos3d [3];
  undefined1 local_140 [16];
  undefined8 local_130;
  double local_128;
  type local_120;
  container local_108;
  VectorT<double,_2> local_f8;
  VectorT<double,2> local_e8 [16];
  VectorT<double,2> local_d8 [24];
  undefined1 local_c0 [16];
  double local_b0;
  double local_a8;
  undefined1 local_a0 [16];
  container local_90;
  VectorT<double,_3> local_78;
  VectorT<double,3> local_60 [24];
  VectorT<double,3> local_48 [24];
  
  local_b0 = epsilon;
  initHashMap(mesh,x,epsilon);
  auVar19 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  local_a0 = auVar19;
  auVar22 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
  while( true ) {
    if (auVar22 == auVar19._0_12_) {
      auVar20 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)mesh);
      local_78.values_._M_elems._0_16_ = auVar20;
      local_c0 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
      do {
        _eh.super_BaseHandle.idx_ = auVar20._8_4_;
        bVar5 = _eh.super_BaseHandle.idx_ == (BaseHandle)local_c0._8_4_ &&
                auVar20._0_8_ == local_c0._0_8_;
        if (bVar5) {
          return bVar5;
        }
        local_140._0_4_ = _eh.super_BaseHandle.idx_;
        bVar6 = OpenMesh::PolyConnectivity::is_boundary((PolyConnectivity *)mesh,_eh);
        if (bVar6) {
          lVar9 = *(long *)&(mesh->super_Mesh).
                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                            .super_PolyConnectivity.field_0xe0;
          lVar11 = ((auVar20._8_8_ << 0x21) >> 0x21) * 0x20;
          iVar1 = *(int *)(lVar9 + 0x14 + lVar11);
          iVar2 = *(int *)(lVar9 + 4 + lVar11);
          pdVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          dVar12 = pdVar4[(long)iVar2 * 2];
          dVar15 = pdVar4[(long)iVar1 * 2];
          dVar14 = dVar12;
          if (dVar15 <= dVar12) {
            dVar14 = dVar15;
          }
          iVar10 = (int)(dVar14 / local_b0 + -1.0);
          if (dVar12 <= dVar15) {
            dVar12 = dVar15;
          }
          dVar12 = dVar12 / local_b0;
          dVar15 = pdVar4[iVar2 * 2 + 1];
          dVar14 = pdVar4[iVar1 * 2 + 1];
          dVar16 = dVar15;
          if (dVar14 <= dVar15) {
            dVar16 = dVar14;
          }
          dVar16 = dVar16 / local_b0;
          if (dVar15 <= dVar14) {
            dVar15 = dVar14;
          }
          dVar15 = dVar15 / local_b0;
          for (; iVar7 = (int)(dVar16 + -1.0), iVar10 <= (int)(dVar12 + 1.0); iVar10 = iVar10 + 1) {
            for (; iVar7 <= (int)(dVar15 + 1.0); iVar7 = iVar7 + 1) {
              local_f8.values_._M_elems[0]._0_4_ = iVar10;
              local_f8.values_._M_elems[0]._4_4_ = iVar7;
              pVar21 = std::
                       _Hashtable<OpenMesh::VectorT<int,_2>,_std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>,_std::__detail::_Select1st,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_myHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                       ::equal_range(&neighbors._M_h,(key_type *)&local_f8);
              for (_Var8._M_cur = (__node_type *)
                                  pVar21.first.
                                  super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                  ._M_cur;
                  (_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>)
                  _Var8._M_cur !=
                  pVar21.second.
                  super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>.
                  _M_cur.
                  super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>;
                  _Var8._M_cur = (__node_type *)((_Var8._M_cur)->super__Hash_node_base)._M_nxt) {
                iVar3 = *(int *)((long)&((_Var8._M_cur)->
                                        super__Hash_node_value<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>
                                        ._M_storage._M_storage + 8);
                if ((iVar3 != iVar1) && (iVar3 != iVar2)) {
                  local_f8.values_._M_elems[0]._0_4_ = iVar3;
                  dVar14 = getDistance(mesh,x,(EdgeHandle *)local_140,(VertexHandle *)&local_f8);
                  if ((dVar14 == 0.0) && (!NAN(dVar14))) {
                    return bVar5;
                  }
                }
              }
            }
          }
        }
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
        ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                      *)&local_78);
        auVar20._8_8_ = (ulong)local_78.values_._M_elems[1] & 0xffffffff;
        auVar20._0_8_ = local_78.values_._M_elems[0];
      } while( true );
    }
    _rhs = &local_f8;
    tVar17 = OpenMesh::VectorT<double,2>::operator-(local_e8,_rhs);
    tVar18 = OpenMesh::VectorT<double,2>::operator-(local_d8,_rhs);
    dVar15 = tVar18.values_._M_elems[1] * tVar17.values_._M_elems[0];
    dVar12 = tVar18.values_._M_elems[0] * tVar17.values_._M_elems[1];
    if ((dVar15 == dVar12) && (!NAN(dVar15) && !NAN(dVar12))) {
      return false;
    }
    local_120.values_._M_elems[1]._0_4_ = auVar19._8_4_;
    local_120.values_._M_elems[0] = (double)mesh;
    local_140._8_4_ =
         *(undefined4 *)
          (*(long *)&(mesh->super_Mesh).
                     super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                     .super_PolyConnectivity.field_0xf8 + (long)auVar19._8_4_ * 4);
    local_140._0_8_ = mesh;
    local_140._12_4_ = local_140._8_4_;
    local_130._0_4_ = 0;
    local_130._4_4_ = 0xffffffff;
    OpenMesh::PolyConnectivity::
    CirculatorRange<OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>,_OpenMesh::FaceHandle,_&OpenMesh::PolyConnectivity::cfv_begin,_&OpenMesh::PolyConnectivity::cfv_end>
    ::end((GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
           *)&local_90,
          (CirculatorRange<OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>,_OpenMesh::FaceHandle,_&OpenMesh::PolyConnectivity::cfv_begin,_&OpenMesh::PolyConnectivity::cfv_end>
           *)&local_120);
    this = (VectorT<double,3> *)&local_78;
    while( true ) {
      bVar5 = OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::operator!=
                        ((GenericCirculatorBaseT<OpenMesh::PolyConnectivity> *)local_140,
                         (GenericCirculatorBaseT<OpenMesh::PolyConnectivity> *)&local_90);
      if (!bVar5) break;
      lVar9 = (long)*(int *)((ulong)((local_140._12_4_ & 1) << 4) + 4 +
                            (long)((int)local_140._12_4_ >> 1) * 0x20 +
                            *(long *)(local_140._0_8_ + 0xe0));
      OpenMesh::VectorT<double,3>::operator=
                (this,(VectorT<float,_3> *)
                      (lVar9 * 0xc +
                      *(long *)(*(long *)(*(long *)&(mesh->super_Mesh).
                                                                                                        
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                                  .super_PolyConnectivity.field_0x10 +
                                         (long)(mesh->super_Mesh).
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                               .points_.
                                               super_BasePropHandleT<OpenMesh::VectorT<float,_3>_>.
                                               super_BaseHandle.idx_ * 8) + 0x30)));
      pdVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + lVar9 * 2;
      dVar12 = pdVar4[1];
      (_rhs->values_)._M_elems[0] = *pdVar4;
      (_rhs->values_)._M_elems[1] = dVar12;
      OpenMesh::Iterators::
      GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
      ::operator++((GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    *)local_140);
      _rhs = _rhs + 1;
      this = this + 0x18;
    }
    local_90._M_elems = (_Type)OpenMesh::VectorT<double,2>::operator-(local_e8,&local_f8);
    OpenMesh::VectorT<double,3>::operator-((type *)local_140,local_60,&local_78);
    pPVar13 = (PolyConnectivity *)
              OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)local_140);
    local_120.values_._M_elems[0] = (double)pPVar13;
    local_108._M_elems =
         (_Type)OpenMesh::VectorT<double,2>::operator/
                          ((VectorT<double,2> *)&local_90,(double *)&local_120);
    OpenMesh::VectorT<double,3>::operator-((type *)local_140,local_48,&local_78);
    OpenMesh::VectorT<double,3>::operator-((type *)&local_90,local_60,&local_78);
    dVar12 = OpenMesh::VectorT<double,3>::operator|
                       ((VectorT<double,_3> *)local_140,(VectorT<double,_3> *)&local_90);
    OpenMesh::VectorT<double,3>::operator-(&local_120,local_60,&local_78);
    local_128 = OpenMesh::VectorT<double,_3>::norm<double>(&local_120);
    local_128 = dVar12 / local_128;
    OpenMesh::VectorT<double,3>::operator-((type *)local_140,local_48,&local_78);
    OpenMesh::VectorT<double,3>::operator-((type *)&local_90,local_48,&local_78);
    dVar12 = OpenMesh::VectorT<double,3>::operator|
                       ((VectorT<double,_3> *)local_140,(VectorT<double,_3> *)&local_90);
    dVar12 = dVar12 - local_128 * local_128;
    if (dVar12 < 0.0) {
      local_a8 = sqrt(dVar12);
    }
    else {
      local_a8 = SQRT(dVar12);
    }
    local_90._M_elems = (_Type)OpenMesh::VectorT<double,2>::operator-(local_d8,&local_f8);
    local_120.values_._M_elems._0_16_ =
         OpenMesh::VectorT<double,2>::operator*((VectorT<double,2> *)&local_108,&local_128);
    local_140 = (undefined1  [16])
                OpenMesh::VectorT<double,2>::operator-
                          ((VectorT<double,2> *)&local_90,(VectorT<double,_2> *)&local_120);
    tVar17 = OpenMesh::VectorT<double,2>::operator/((VectorT<double,2> *)local_140,&local_a8);
    if (tVar17.values_._M_elems[1] * local_108._M_elems[0] -
        tVar17.values_._M_elems[0] * local_108._M_elems[1] < 0.0) break;
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_a0);
    auVar19._8_8_ = local_a0._8_8_ & 0xffffffff;
    auVar19._0_8_ = local_a0._0_8_;
  }
  return false;
}

Assistant:

bool checkCreterion(const Mesh& mesh, const Eigen::VectorXd& x, double epsilon) {
    initHashMap(mesh, x, epsilon);
    for (auto f: mesh.all_faces()) {
        // get the vertices associated with this triangle
        OpenMesh::VertexHandle vs[3];
        OpenMesh::Vec2d param[3];
        OpenMesh::Vec3d pos3d[3];
        OpenMesh::Vec2d u1 = param[1] - param[0];
        OpenMesh::Vec2d u2 = param[2] - param[0];

        if (u2[1] * u1[0] == u2[0] * u1[1])
            return false;

        int count = 0;
        for (auto v: mesh.fv_range(f)) {
            vs[count] = v;
            pos3d[count] = mesh.point(v);
            param[count] = OpenMesh::Vec2d(x[v.idx() * 2], x[v.idx() * 2 + 1]);
            ++count;
        }
        // check non-flip and bijective
        OpenMesh::Vec2d e1 = (param[1] - param[0]) / (pos3d[1] - pos3d[0]).norm();
        double xc = OpenMesh::dot(pos3d[2] - pos3d[0], pos3d[1] - pos3d[0]) / (pos3d[1] - pos3d[0]).norm();
        double yc = sqrt(OpenMesh::dot(pos3d[2] - pos3d[0], pos3d[2] - pos3d[0]) - xc * xc);
        OpenMesh::Vec2d e2 =  (param[2] - param[0] - e1 * xc) / yc; 
        double x00 = e1[0];
        double x10 = e1[1];
        double x01 = e2[0];
        double x11 = e2[1];
        double det = x00 * x11 - x01 * x10;
        if (det < 0.0)
            return false;
    }

    // check the degeneration of boundary points
    for (auto e: mesh.all_edges())
        if (mesh.is_boundary(e)) {
            int st = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            int end = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            // The range for neighborhood searching
            int x_st = std::min(x[2 * st], x[2 * end]) / epsilon - 1;
            int x_end = std::max(x[2 * st], x[2 * end]) / epsilon + 1;
            int y_st = std::min(x[2 * st + 1], x[2 * end + 1]) / epsilon - 1;
            int y_end = std::max(x[2 * st + 1], x[2 * end + 1]) / epsilon + 1;
            // conduct neighbor search for neighbor boundaries points
            for (int xs = x_st; xs <= x_end; ++xs)
                for (int y = y_st; y <= y_end; ++y) {
                    auto itr_pr = neighbors.equal_range(OpenMesh::Vec2i(xs, y));
                    for (auto itr = itr_pr.first; itr != itr_pr.second; ++itr)
                        if (itr->second != st && itr->second != end) {
                            double dis = getDistance(mesh, x, e, OpenMesh::VertexHandle(itr->second));
                            if (dis == 0.0)
                                return false;
                        }
                    }
        }
    return true;
}